

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dh.cc
# Opt level: O0

int pkey_dh_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  DH_PKEY_CTX *dctx;
  DH_PKEY_CTX *sctx;
  EVP_PKEY_CTX *src_local;
  EVP_PKEY_CTX *dst_local;
  
  iVar1 = pkey_dh_init(dst);
  if (iVar1 != 0) {
    *(undefined4 *)dst->data = *src->data;
  }
  dst_local._4_4_ = (uint)(iVar1 != 0);
  return dst_local._4_4_;
}

Assistant:

static int pkey_dh_copy(EVP_PKEY_CTX *dst, EVP_PKEY_CTX *src) {
  if (!pkey_dh_init(dst)) {
    return 0;
  }

  const DH_PKEY_CTX *sctx = reinterpret_cast<DH_PKEY_CTX *>(src->data);
  DH_PKEY_CTX *dctx = reinterpret_cast<DH_PKEY_CTX *>(dst->data);
  dctx->pad = sctx->pad;
  return 1;
}